

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O1

int32_t FACT_INTERNAL_DefaultReadFile
                  (void *hFile,void *buffer,uint32_t nNumberOfBytesToRead,
                  uint32_t *lpNumberOfBytesRead,FACTOverlapped *lpOverlapped)

{
  long lVar1;
  
  lpOverlapped->Internal = (void *)0x103;
  FAudio_PlatformLockMutex(*(FAudioMutex *)((long)hFile + 0x20));
  (**(code **)((long)hFile + 0x10))(*hFile,(lpOverlapped->field_2).Pointer,0);
  lVar1 = (**(code **)((long)hFile + 8))(*hFile,buffer,(ulong)nNumberOfBytesToRead,1);
  lpOverlapped->InternalHigh = (void *)(lVar1 * (ulong)nNumberOfBytesToRead);
  FAudio_PlatformUnlockMutex(*(FAudioMutex *)((long)hFile + 0x20));
  lpOverlapped->Internal = (void *)0x0;
  return 1;
}

Assistant:

int32_t FACTCALL FACT_INTERNAL_DefaultReadFile(
	void *hFile,
	void *buffer,
	uint32_t nNumberOfBytesToRead,
	uint32_t *lpNumberOfBytesRead, /* Not referenced! */
	FACTOverlapped *lpOverlapped
) {
	FAudioIOStream *io = (FAudioIOStream*) hFile;
	lpOverlapped->Internal = (void*) 0x00000103; /* STATUS_PENDING */
	FAudio_PlatformLockMutex((FAudioMutex) io->lock);
	io->seek(io->data, (size_t) lpOverlapped->Pointer, FAUDIO_SEEK_SET);
	lpOverlapped->InternalHigh = (void*) (size_t) (io->read(
		io->data,
		buffer,
		nNumberOfBytesToRead,
		1
	) * nNumberOfBytesToRead);
	FAudio_PlatformUnlockMutex((FAudioMutex) io->lock);
	lpOverlapped->Internal = 0; /* STATUS_SUCCESS */
	return 1;
}